

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O1

_Bool Hacl_Impl_Ed25519_PointDecompress_point_decompress(uint64_t *out,uint8_t *s)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  ulong uVar560;
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  int iVar567;
  uint64_t yi_135;
  ulong uVar568;
  uint64_t b0;
  uint64_t yi_22;
  uint64_t yi_15;
  ulong uVar569;
  _Bool _Var570;
  uint64_t yi_12;
  uint64_t yi_8;
  uint64_t yi_17;
  uint64_t yi_16;
  ulong uVar571;
  uint64_t input2i;
  uint64_t yi_13;
  ulong uVar572;
  uint64_t yi;
  ulong uVar573;
  _Bool _Var574;
  uint64_t yi_26;
  uint64_t yi_28;
  uint64_t yi_23;
  uint64_t yi_24;
  uint64_t yi_6;
  uint64_t yi_7;
  FStar_UInt128_t t [5];
  uint64_t tmp [10];
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  ulong local_260;
  ulong local_258;
  ulong uStack_250;
  ulong local_248;
  ulong uStack_240;
  ulong local_238;
  ulong local_230;
  ulong uStack_228;
  ulong uStack_220;
  ulong uStack_218;
  ulong uStack_210;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  ulong local_1d0;
  ulong uStack_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_160 [16];
  ulong *local_150;
  ulong local_148;
  ulong uStack_140;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  uint64_t uStack_120;
  ulong local_118;
  ulong uStack_110;
  ulong local_108;
  ulong uStack_100;
  uint64_t local_f8;
  undefined1 auStack_f0 [16];
  undefined1 auStack_e0 [16];
  uint64_t local_d0;
  long lStack_c8;
  long local_c0;
  long lStack_b8;
  long local_b0;
  uint64_t local_a8 [5];
  ulong local_80;
  long lStack_78;
  ulong local_70;
  ulong uStack_68;
  ulong local_60;
  
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  uStack_120 = 0;
  bVar1 = s[0x1f];
  uVar568 = *(ulong *)s;
  uVar571 = *(ulong *)(s + 6) >> 3 & 0x7ffffffffffff;
  uVar573 = *(ulong *)(s + 0xc) >> 6 & 0x7ffffffffffff;
  uVar569 = *(ulong *)(s + 0x13) >> 1 & 0x7ffffffffffff;
  uVar572 = *(ulong *)(s + 0x18) >> 0xc & 0x7ffffffffffff;
  uStack_140 = uVar571;
  local_148 = uVar568 & 0x7ffffffffffff;
  uStack_130 = uVar569;
  local_138 = uVar573;
  local_150 = out;
  local_128 = uVar572;
  memset(&local_258,0,0xa0);
  _Var574 = false;
  if ((uVar572 != 0x7ffffffffffff ||
      (uVar569 != 0x7ffffffffffff || (uVar573 != 0x7ffffffffffff || uVar571 != 0x7ffffffffffff))) ||
      (uVar568 & 0x7ffffffffffff) < 0x7ffffffffffed) {
    memset(&local_f8,0,200);
    local_f8 = 1;
    auStack_f0 = (undefined1  [16])0x0;
    auStack_e0 = (undefined1  [16])0x0;
    Hacl_Bignum25519_fsquare(&local_d0,&local_148);
    uStack_2f0 = 0x1a8283b156ebd;
    local_2f8 = 0x34dca135978a3;
    uStack_2e0 = 0x739c663a03cbb;
    local_2e8 = 0x5e7a26001c029;
    local_2d8 = 0x52036cee2b6ff;
    Hacl_Bignum25519_fmul(&local_80,&local_2f8,&local_d0);
    uVar568 = lStack_78 + auStack_f0._0_8_ + (local_80 + local_f8 >> 0x33);
    local_70 = local_70 + auStack_f0._8_8_ + (uVar568 >> 0x33);
    uStack_68 = uStack_68 + auStack_e0._0_8_ + (local_70 >> 0x33);
    local_70 = local_70 & 0x7ffffffffffff;
    uVar569 = (uStack_68 >> 0x33) + auStack_e0._8_8_ + local_60;
    uStack_68 = uStack_68 & 0x7ffffffffffff;
    local_60 = uVar569 & 0x7ffffffffffff;
    uVar569 = (uVar569 >> 0x33) * 0x13 + (local_80 + local_f8 & 0x7ffffffffffff);
    local_80 = uVar569 & 0x7ffffffffffff;
    lStack_78 = (uVar569 >> 0x33) + (uVar568 & 0x7ffffffffffff);
    Hacl_Bignum25519_inverse(local_a8,&local_80);
    local_f8 = (local_d0 - local_f8) + 0x3fffffffffff68;
    auStack_f0._8_8_ = (local_c0 - auStack_f0._8_8_) + 0x3ffffffffffff8;
    auStack_f0._0_8_ = (lStack_c8 - auStack_f0._0_8_) + 0x3ffffffffffff8;
    auStack_e0._8_8_ = (local_b0 + 0x3ffffffffffff8) - auStack_e0._8_8_;
    auStack_e0._0_8_ = (lStack_b8 - auStack_e0._0_8_) + 0x3ffffffffffff8;
    Hacl_Bignum25519_fmul(&local_258,local_a8,&local_f8);
    Hacl_Bignum25519_reduce(&local_258);
    uVar573 = local_238;
    uVar572 = uStack_240;
    uVar571 = local_248;
    uVar569 = uStack_250;
    uVar568 = local_258;
    iVar567 = 2;
    if ((((local_248 == 0 && uStack_240 == 0) && (local_258 == 0 && uStack_250 == 0)) &&
         local_238 == 0) && (iVar567 = 0, -1 < (char)bVar1)) {
      uStack_110 = 0;
      local_108 = 0;
      uStack_120 = 0;
      local_118 = 0;
      uStack_100 = 0;
      iVar567 = 1;
    }
    if (iVar567 == 0) {
      _Var574 = false;
    }
    else if (iVar567 == 1) {
      _Var574 = true;
    }
    else {
      local_178 = (undefined1  [16])0x0;
      local_188 = (undefined1  [16])0x0;
      local_198 = (undefined1  [16])0x0;
      local_1a8 = (undefined1  [16])0x0;
      local_1b8 = (undefined1  [16])0x0;
      local_2d0 = (undefined1  [16])0x0;
      local_2c0 = (undefined1  [16])0x0;
      local_2b0 = (undefined1  [16])0x0;
      local_2a0 = (undefined1  [16])0x0;
      local_290 = (undefined1  [16])0x0;
      local_280 = (undefined1  [16])0x0;
      local_270 = (undefined1  [16])0x0;
      local_260 = 0;
      local_2f8 = local_258;
      uStack_2f0 = uStack_250;
      local_2e8 = local_248;
      uStack_2e0 = uStack_240;
      local_2d8 = local_238;
      Hacl_Bignum_Fsquare_fsquare_times_(&local_2f8,(FStar_UInt128_t *)local_1b8,1);
      local_178 = ZEXT816(0);
      local_188 = ZEXT816(0);
      local_198 = ZEXT816(0);
      local_1a8 = ZEXT816(0);
      local_1b8 = ZEXT816(0);
      local_2d0._0_8_ = local_2f8;
      local_2d0._8_8_ = uStack_2f0;
      local_2c0._0_8_ = local_2e8;
      local_2c0._8_8_ = uStack_2e0;
      local_2b0._0_8_ = local_2d8;
      Hacl_Bignum_Fsquare_fsquare_times_((uint64_t *)local_2d0,(FStar_UInt128_t *)local_1b8,2);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_2d0._0_8_;
      auVar276._8_8_ = 0;
      auVar276._0_8_ = uVar568;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_2d0._8_8_;
      auVar277._8_8_ = 0;
      auVar277._0_8_ = uVar568;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_2c0._0_8_;
      auVar278._8_8_ = 0;
      auVar278._0_8_ = uVar568;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_2c0._8_8_;
      auVar279._8_8_ = 0;
      auVar279._0_8_ = uVar568;
      uVar560 = local_2b0._0_8_ * 0x13;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_2b0._0_8_;
      auVar280._8_8_ = 0;
      auVar280._0_8_ = uVar568;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar560;
      auVar281._8_8_ = 0;
      auVar281._0_8_ = uVar569;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_2d0._0_8_;
      auVar282._8_8_ = 0;
      auVar282._0_8_ = uVar569;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_2d0._8_8_;
      auVar283._8_8_ = 0;
      auVar283._0_8_ = uVar569;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_2c0._0_8_;
      auVar284._8_8_ = 0;
      auVar284._0_8_ = uVar569;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_2c0._8_8_;
      auVar285._8_8_ = 0;
      auVar285._0_8_ = uVar569;
      local_2c0._8_8_ = local_2c0._8_8_ * 0x13;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_2c0._8_8_;
      auVar286._8_8_ = 0;
      auVar286._0_8_ = uVar571;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar560;
      auVar287._8_8_ = 0;
      auVar287._0_8_ = uVar571;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_2d0._0_8_;
      auVar288._8_8_ = 0;
      auVar288._0_8_ = uVar571;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_2d0._8_8_;
      auVar289._8_8_ = 0;
      auVar289._0_8_ = uVar571;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_2c0._0_8_;
      auVar290._8_8_ = 0;
      auVar290._0_8_ = uVar571;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_2c0._0_8_ * 0x13;
      auVar291._8_8_ = 0;
      auVar291._0_8_ = uVar572;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_2c0._8_8_;
      auVar292._8_8_ = 0;
      auVar292._0_8_ = uVar572;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar560;
      auVar293._8_8_ = 0;
      auVar293._0_8_ = uVar572;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_2d0._0_8_;
      auVar294._8_8_ = 0;
      auVar294._0_8_ = uVar572;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_2d0._8_8_;
      auVar295._8_8_ = 0;
      auVar295._0_8_ = uVar572;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_2d0._8_8_ * 0x13;
      auVar296._8_8_ = 0;
      auVar296._0_8_ = uVar573;
      auVar2 = auVar22 * auVar296 +
               auVar12 * auVar286 + auVar7 * auVar281 + auVar17 * auVar291 + auVar2 * auVar276;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_2c0._0_8_ * 0x13;
      auVar297._8_8_ = 0;
      auVar297._0_8_ = uVar573;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_2c0._8_8_;
      auVar298._8_8_ = 0;
      auVar298._0_8_ = uVar573;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar560;
      auVar299._8_8_ = 0;
      auVar299._0_8_ = uVar573;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_2d0._0_8_;
      auVar300._8_8_ = 0;
      auVar300._0_8_ = uVar573;
      auVar3 = (auVar2 >> 0x33) +
               auVar23 * auVar297 + auVar18 * auVar292 + auVar13 * auVar287 + auVar3 * auVar277 +
               auVar8 * auVar282;
      uVar569 = auVar3._0_8_;
      uVar568 = auVar3._8_8_;
      auVar562._8_8_ = uVar568 >> 0x33;
      auVar562._0_8_ = uVar568 * 0x2000 | uVar569 >> 0x33;
      auVar562 = auVar9 * auVar283 + auVar4 * auVar278 + auVar19 * auVar293 + auVar24 * auVar298 +
                 auVar14 * auVar288 + auVar562;
      local_2a0._8_8_ = auVar562._0_8_;
      uVar568 = auVar562._8_8_;
      auVar563._8_8_ = uVar568 >> 0x33;
      auVar563._0_8_ = uVar568 * 0x2000 | (ulong)local_2a0._8_8_ >> 0x33;
      auVar563 = auVar15 * auVar289 + auVar25 * auVar299 + auVar5 * auVar279 + auVar10 * auVar284 +
                 auVar20 * auVar294 + auVar563;
      local_290._0_8_ = auVar563._0_8_;
      uVar568 = auVar563._8_8_;
      auVar551._8_8_ = uVar568 >> 0x33;
      auVar551._0_8_ = uVar568 * 0x2000 | (ulong)local_290._0_8_ >> 0x33;
      auVar551 = auVar11 * auVar285 + auVar6 * auVar280 + auVar16 * auVar290 + auVar21 * auVar295 +
                 auVar26 * auVar300 + auVar551;
      local_290._8_8_ = auVar551._0_8_;
      uVar568 = (auVar551._8_8_ << 0xd | (ulong)local_290._8_8_ >> 0x33) * 0x13 +
                (auVar2._0_8_ & 0x7ffffffffffff);
      local_2a0._8_8_ = local_2a0._8_8_ & 0x7ffffffffffff;
      local_290._0_8_ = local_290._0_8_ & 0x7ffffffffffff;
      local_290._8_8_ = local_290._8_8_ & 0x7ffffffffffff;
      local_2b0._8_8_ = uVar568 & 0x7ffffffffffff;
      local_2a0._0_8_ = (uVar568 >> 0x33) + (uVar569 & 0x7ffffffffffff);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_2b0._8_8_;
      auVar301._8_8_ = 0;
      auVar301._0_8_ = local_2f8;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_2a0._0_8_;
      auVar302._8_8_ = 0;
      auVar302._0_8_ = local_2f8;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_2a0._8_8_;
      auVar303._8_8_ = 0;
      auVar303._0_8_ = local_2f8;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_290._0_8_;
      auVar304._8_8_ = 0;
      auVar304._0_8_ = local_2f8;
      uVar568 = local_290._8_8_ * 0x13;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_290._8_8_;
      auVar305._8_8_ = 0;
      auVar305._0_8_ = local_2f8;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar568;
      auVar306._8_8_ = 0;
      auVar306._0_8_ = uStack_2f0;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_2b0._8_8_;
      auVar307._8_8_ = 0;
      auVar307._0_8_ = uStack_2f0;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_2a0._0_8_;
      auVar308._8_8_ = 0;
      auVar308._0_8_ = uStack_2f0;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_2a0._8_8_;
      auVar309._8_8_ = 0;
      auVar309._0_8_ = uStack_2f0;
      uVar569 = local_290._0_8_ * 0x13;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_290._0_8_;
      auVar310._8_8_ = 0;
      auVar310._0_8_ = uStack_2f0;
      local_160._8_8_ = 0;
      local_160._0_8_ = uVar569;
      auVar311._8_8_ = 0;
      auVar311._0_8_ = local_2e8;
      local_160 = local_160 * auVar311;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar568;
      auVar312._8_8_ = 0;
      auVar312._0_8_ = local_2e8;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_2b0._8_8_;
      auVar313._8_8_ = 0;
      auVar313._0_8_ = local_2e8;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_2a0._0_8_;
      auVar314._8_8_ = 0;
      auVar314._0_8_ = local_2e8;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_2a0._8_8_;
      auVar315._8_8_ = 0;
      auVar315._0_8_ = local_2e8;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_2a0._8_8_ * 0x13;
      auVar316._8_8_ = 0;
      auVar316._0_8_ = uStack_2e0;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar569;
      auVar317._8_8_ = 0;
      auVar317._0_8_ = uStack_2e0;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar568;
      auVar318._8_8_ = 0;
      auVar318._0_8_ = uStack_2e0;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_2b0._8_8_;
      auVar319._8_8_ = 0;
      auVar319._0_8_ = uStack_2e0;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_2a0._0_8_;
      auVar320._8_8_ = 0;
      auVar320._0_8_ = uStack_2e0;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_2a0._0_8_ * 0x13;
      auVar321._8_8_ = 0;
      auVar321._0_8_ = local_2d8;
      auVar2 = auVar46 * auVar321 +
               auVar41 * auVar316 + local_160 + auVar27 * auVar301 + auVar32 * auVar306;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_2d8;
      auVar322._8_8_ = 0;
      auVar322._0_8_ = local_2a0._8_8_ * 0x13;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar569;
      auVar323._8_8_ = 0;
      auVar323._0_8_ = local_2d8;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar568;
      auVar324._8_8_ = 0;
      auVar324._0_8_ = local_2d8;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_2b0._8_8_;
      auVar325._8_8_ = 0;
      auVar325._0_8_ = local_2d8;
      auVar3 = (auVar2 >> 0x33) +
               auVar47 * auVar322 + auVar42 * auVar317 + auVar33 * auVar307 + auVar37 * auVar312 +
               auVar28 * auVar302;
      uVar569 = auVar3._0_8_;
      uVar568 = auVar3._8_8_;
      auVar564._8_8_ = uVar568 >> 0x33;
      auVar564._0_8_ = uVar568 * 0x2000 | uVar569 >> 0x33;
      auVar564 = auVar29 * auVar303 + auVar48 * auVar323 + auVar38 * auVar313 + auVar43 * auVar318 +
                 auVar34 * auVar308 + auVar564;
      local_2c0._0_8_ = auVar564._0_8_;
      uVar568 = auVar564._8_8_;
      auVar565._8_8_ = uVar568 >> 0x33;
      auVar565._0_8_ = uVar568 * 0x2000 | (ulong)local_2c0._0_8_ >> 0x33;
      auVar565 = auVar49 * auVar324 + auVar35 * auVar309 + auVar30 * auVar304 + auVar44 * auVar319 +
                 auVar39 * auVar314 + auVar565;
      local_2c0._8_8_ = auVar565._0_8_;
      uVar568 = auVar565._8_8_;
      auVar566._8_8_ = uVar568 >> 0x33;
      auVar566._0_8_ = uVar568 * 0x2000 | (ulong)local_2c0._8_8_ >> 0x33;
      auVar566 = auVar50 * auVar325 + auVar36 * auVar310 + auVar40 * auVar315 + auVar31 * auVar305 +
                 auVar45 * auVar320 + auVar566;
      local_2d8 = auVar566._0_8_;
      local_2d0._0_8_ =
           (auVar566._8_8_ * 0x2000 | local_2d8 >> 0x33) * 0x13 + (auVar2._0_8_ & 0x7ffffffffffff);
      local_2c0._0_8_ = local_2c0._0_8_ & 0x7ffffffffffff;
      local_2c0._8_8_ = local_2c0._8_8_ & 0x7ffffffffffff;
      local_2d0._8_8_ = ((ulong)local_2d0._0_8_ >> 0x33) + (uVar569 & 0x7ffffffffffff);
      local_2d8 = local_2d8 & 0x7ffffffffffff;
      local_2d0._0_8_ = local_2d0._0_8_ & 0x7ffffffffffff;
      local_178 = ZEXT816(0);
      local_188 = ZEXT816(0);
      local_198 = ZEXT816(0);
      local_1a8 = ZEXT816(0);
      local_1b8 = ZEXT816(0);
      local_2b0._0_8_ = local_2d8;
      local_2f8 = local_2d0._0_8_;
      uStack_2f0 = local_2d0._8_8_;
      local_2e8 = local_2c0._0_8_;
      uStack_2e0 = local_2c0._8_8_;
      Hacl_Bignum_Fsquare_fsquare_times_((uint64_t *)local_2d0,(FStar_UInt128_t *)local_1b8,1);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_2b0._8_8_;
      auVar326._8_8_ = 0;
      auVar326._0_8_ = local_2d0._0_8_;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_2b0._8_8_;
      auVar327._8_8_ = 0;
      auVar327._0_8_ = local_2d0._8_8_;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_2b0._8_8_;
      auVar328._8_8_ = 0;
      auVar328._0_8_ = local_2c0._0_8_;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_2b0._8_8_;
      auVar329._8_8_ = 0;
      auVar329._0_8_ = local_2c0._8_8_;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_2b0._8_8_;
      auVar330._8_8_ = 0;
      auVar330._0_8_ = local_2b0._0_8_;
      local_2b0._0_8_ = local_2b0._0_8_ * 0x13;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_2a0._0_8_;
      auVar331._8_8_ = 0;
      auVar331._0_8_ = local_2b0._0_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = local_2a0._0_8_;
      auVar332._8_8_ = 0;
      auVar332._0_8_ = local_2d0._0_8_;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_2a0._0_8_;
      auVar333._8_8_ = 0;
      auVar333._0_8_ = local_2d0._8_8_;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_2a0._0_8_;
      auVar334._8_8_ = 0;
      auVar334._0_8_ = local_2c0._0_8_;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_2a0._0_8_;
      auVar335._8_8_ = 0;
      auVar335._0_8_ = local_2c0._8_8_;
      local_2c0._8_8_ = local_2c0._8_8_ * 0x13;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_2a0._8_8_;
      auVar336._8_8_ = 0;
      auVar336._0_8_ = local_2c0._8_8_;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_2a0._8_8_;
      auVar337._8_8_ = 0;
      auVar337._0_8_ = local_2b0._0_8_;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_2a0._8_8_;
      auVar338._8_8_ = 0;
      auVar338._0_8_ = local_2d0._0_8_;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = local_2a0._8_8_;
      auVar339._8_8_ = 0;
      auVar339._0_8_ = local_2d0._8_8_;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_2a0._8_8_;
      auVar340._8_8_ = 0;
      auVar340._0_8_ = local_2c0._0_8_;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_290._0_8_;
      auVar341._8_8_ = 0;
      auVar341._0_8_ = local_2c0._0_8_ * 0x13;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = local_290._0_8_;
      auVar342._8_8_ = 0;
      auVar342._0_8_ = local_2c0._8_8_;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = local_290._0_8_;
      auVar343._8_8_ = 0;
      auVar343._0_8_ = local_2b0._0_8_;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = local_290._0_8_;
      auVar344._8_8_ = 0;
      auVar344._0_8_ = local_2d0._0_8_;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = local_290._0_8_;
      auVar345._8_8_ = 0;
      auVar345._0_8_ = local_2d0._8_8_;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = local_290._8_8_;
      auVar346._8_8_ = 0;
      auVar346._0_8_ = local_2d0._8_8_ * 0x13;
      auVar3 = auVar66 * auVar341 + auVar61 * auVar336 + auVar56 * auVar331 + auVar51 * auVar326 +
               auVar71 * auVar346;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = local_290._8_8_;
      auVar347._8_8_ = 0;
      auVar347._0_8_ = local_2c0._0_8_ * 0x13;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = local_290._8_8_;
      auVar348._8_8_ = 0;
      auVar348._0_8_ = local_2c0._8_8_;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = local_290._8_8_;
      auVar349._8_8_ = 0;
      auVar349._0_8_ = local_2b0._0_8_;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = local_290._8_8_;
      auVar350._8_8_ = 0;
      auVar350._0_8_ = local_2d0._0_8_;
      auVar4 = auVar72 * auVar347 +
               auVar67 * auVar342 + auVar57 * auVar332 + auVar52 * auVar327 + auVar62 * auVar337 +
               (auVar3 >> 0x33);
      auVar2 = (auVar4 >> 0x33) +
               auVar73 * auVar348 +
               auVar63 * auVar338 + auVar58 * auVar333 + auVar53 * auVar328 + auVar68 * auVar343;
      local_2c0._0_8_ = auVar2._0_8_;
      uVar568 = auVar2._8_8_;
      auVar561._8_8_ = uVar568 >> 0x33;
      auVar561._0_8_ = uVar568 * 0x2000 | (ulong)local_2c0._0_8_ >> 0x33;
      auVar561 = auVar64 * auVar339 + auVar59 * auVar334 + auVar54 * auVar329 + auVar69 * auVar344 +
                 auVar74 * auVar349 + auVar561;
      auVar2 = auVar75 * auVar350 +
               auVar70 * auVar345 + auVar65 * auVar340 + auVar60 * auVar335 + auVar55 * auVar330 +
               (auVar561 >> 0x33);
      local_2b0._0_8_ = auVar2._0_8_;
      local_2d0._0_8_ =
           (auVar2._8_8_ << 0xd | (ulong)local_2b0._0_8_ >> 0x33) * 0x13 +
           (auVar3._0_8_ & 0x7ffffffffffff);
      local_2c0._0_8_ = local_2c0._0_8_ & 0x7ffffffffffff;
      local_2c0._8_8_ = auVar561._0_8_ & 0x7ffffffffffff;
      local_2d0._8_8_ = ((ulong)local_2d0._0_8_ >> 0x33) + (auVar4._0_8_ & 0x7ffffffffffff);
      local_2b0._0_8_ = local_2b0._0_8_ & 0x7ffffffffffff;
      local_2d0._0_8_ = local_2d0._0_8_ & 0x7ffffffffffff;
      local_178 = ZEXT816(0);
      local_188 = ZEXT816(0);
      local_198 = ZEXT816(0);
      local_1a8 = ZEXT816(0);
      local_1b8 = ZEXT816(0);
      local_290._8_8_ = local_2b0._0_8_;
      local_2b0._8_8_ = local_2d0._0_8_;
      local_2a0._0_8_ = local_2d0._8_8_;
      local_2a0._8_8_ = local_2c0._0_8_;
      local_290._0_8_ = local_2c0._8_8_;
      Hacl_Bignum_Fsquare_fsquare_times_((uint64_t *)local_2d0,(FStar_UInt128_t *)local_1b8,5);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = local_2b0._8_8_;
      auVar351._8_8_ = 0;
      auVar351._0_8_ = local_2d0._0_8_;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = local_2b0._8_8_;
      auVar352._8_8_ = 0;
      auVar352._0_8_ = local_2d0._8_8_;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = local_2b0._8_8_;
      auVar353._8_8_ = 0;
      auVar353._0_8_ = local_2c0._0_8_;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_2b0._8_8_;
      auVar354._8_8_ = 0;
      auVar354._0_8_ = local_2c0._8_8_;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = local_2b0._8_8_;
      auVar355._8_8_ = 0;
      auVar355._0_8_ = local_2b0._0_8_;
      local_2b0._0_8_ = local_2b0._0_8_ * 0x13;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = local_2a0._0_8_;
      auVar356._8_8_ = 0;
      auVar356._0_8_ = local_2b0._0_8_;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = local_2a0._0_8_;
      auVar357._8_8_ = 0;
      auVar357._0_8_ = local_2d0._0_8_;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = local_2a0._0_8_;
      auVar358._8_8_ = 0;
      auVar358._0_8_ = local_2d0._8_8_;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = local_2a0._0_8_;
      auVar359._8_8_ = 0;
      auVar359._0_8_ = local_2c0._0_8_;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = local_2a0._0_8_;
      auVar360._8_8_ = 0;
      auVar360._0_8_ = local_2c0._8_8_;
      local_2c0._8_8_ = local_2c0._8_8_ * 0x13;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = local_2a0._8_8_;
      auVar361._8_8_ = 0;
      auVar361._0_8_ = local_2c0._8_8_;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = local_2a0._8_8_;
      auVar362._8_8_ = 0;
      auVar362._0_8_ = local_2b0._0_8_;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = local_2a0._8_8_;
      auVar363._8_8_ = 0;
      auVar363._0_8_ = local_2d0._0_8_;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = local_2a0._8_8_;
      auVar364._8_8_ = 0;
      auVar364._0_8_ = local_2d0._8_8_;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = local_2a0._8_8_;
      auVar365._8_8_ = 0;
      auVar365._0_8_ = local_2c0._0_8_;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = local_290._0_8_;
      auVar366._8_8_ = 0;
      auVar366._0_8_ = local_2c0._0_8_ * 0x13;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = local_290._0_8_;
      auVar367._8_8_ = 0;
      auVar367._0_8_ = local_2c0._8_8_;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = local_290._0_8_;
      auVar368._8_8_ = 0;
      auVar368._0_8_ = local_2b0._0_8_;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = local_290._0_8_;
      auVar369._8_8_ = 0;
      auVar369._0_8_ = local_2d0._0_8_;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = local_290._0_8_;
      auVar370._8_8_ = 0;
      auVar370._0_8_ = local_2d0._8_8_;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = local_290._8_8_;
      auVar371._8_8_ = 0;
      auVar371._0_8_ = local_2d0._8_8_ * 0x13;
      auVar2 = auVar81 * auVar356 + auVar76 * auVar351 + auVar86 * auVar361 + auVar91 * auVar366 +
               auVar96 * auVar371;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = local_290._8_8_;
      auVar372._8_8_ = 0;
      auVar372._0_8_ = local_2c0._0_8_ * 0x13;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = local_290._8_8_;
      auVar373._8_8_ = 0;
      auVar373._0_8_ = local_2c0._8_8_;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = local_290._8_8_;
      auVar374._8_8_ = 0;
      auVar374._0_8_ = local_2b0._0_8_;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = local_290._8_8_;
      auVar375._8_8_ = 0;
      auVar375._0_8_ = local_2d0._0_8_;
      auVar3 = auVar82 * auVar357 + auVar77 * auVar352 + auVar87 * auVar362 + auVar92 * auVar367 +
               auVar97 * auVar372 + (auVar2 >> 0x33);
      auVar4 = auVar88 * auVar363 + auVar83 * auVar358 + auVar78 * auVar353 + auVar93 * auVar368 +
               auVar98 * auVar373 + (auVar3 >> 0x33);
      auVar5 = (auVar4 >> 0x33) +
               auVar99 * auVar374 +
               auVar89 * auVar364 + auVar79 * auVar354 + auVar84 * auVar359 + auVar94 * auVar369;
      local_2c0._8_8_ = auVar5._0_8_;
      uVar568 = auVar5._8_8_;
      auVar552._8_8_ = uVar568 >> 0x33;
      auVar552._0_8_ = uVar568 * 0x2000 | (ulong)local_2c0._8_8_ >> 0x33;
      auVar552 = auVar100 * auVar375 +
                 auVar95 * auVar370 + auVar90 * auVar365 + auVar85 * auVar360 + auVar80 * auVar355 +
                 auVar552;
      local_2b0._0_8_ = auVar552._0_8_;
      local_2d0._0_8_ =
           (auVar552._8_8_ << 0xd | (ulong)local_2b0._0_8_ >> 0x33) * 0x13 +
           (auVar2._0_8_ & 0x7ffffffffffff);
      local_2c0._0_8_ = auVar4._0_8_ & 0x7ffffffffffff;
      local_2c0._8_8_ = local_2c0._8_8_ & 0x7ffffffffffff;
      local_2d0._8_8_ = ((ulong)local_2d0._0_8_ >> 0x33) + (auVar3._0_8_ & 0x7ffffffffffff);
      local_2b0._0_8_ = local_2b0._0_8_ & 0x7ffffffffffff;
      local_2d0._0_8_ = local_2d0._0_8_ & 0x7ffffffffffff;
      local_178 = ZEXT816(0);
      local_188 = ZEXT816(0);
      local_198 = ZEXT816(0);
      local_1a8 = ZEXT816(0);
      local_1b8 = ZEXT816(0);
      local_290._8_8_ = local_2b0._0_8_;
      local_2b0._8_8_ = local_2d0._0_8_;
      local_2a0._0_8_ = local_2d0._8_8_;
      local_2a0._8_8_ = local_2c0._0_8_;
      local_290._0_8_ = local_2c0._8_8_;
      Hacl_Bignum_Fsquare_fsquare_times_((uint64_t *)local_2d0,(FStar_UInt128_t *)local_1b8,10);
      auVar101._8_8_ = 0;
      auVar101._0_8_ = local_2b0._8_8_;
      auVar376._8_8_ = 0;
      auVar376._0_8_ = local_2d0._0_8_;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = local_2b0._8_8_;
      auVar377._8_8_ = 0;
      auVar377._0_8_ = local_2d0._8_8_;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = local_2b0._8_8_;
      auVar378._8_8_ = 0;
      auVar378._0_8_ = local_2c0._0_8_;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = local_2b0._8_8_;
      auVar379._8_8_ = 0;
      auVar379._0_8_ = local_2c0._8_8_;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = local_2b0._8_8_;
      auVar380._8_8_ = 0;
      auVar380._0_8_ = local_2b0._0_8_;
      local_2b0._0_8_ = local_2b0._0_8_ * 0x13;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = local_2a0._0_8_;
      auVar381._8_8_ = 0;
      auVar381._0_8_ = local_2b0._0_8_;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = local_2a0._0_8_;
      auVar382._8_8_ = 0;
      auVar382._0_8_ = local_2d0._0_8_;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = local_2a0._0_8_;
      auVar383._8_8_ = 0;
      auVar383._0_8_ = local_2d0._8_8_;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = local_2a0._0_8_;
      auVar384._8_8_ = 0;
      auVar384._0_8_ = local_2c0._0_8_;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = local_2a0._0_8_;
      auVar385._8_8_ = 0;
      auVar385._0_8_ = local_2c0._8_8_;
      local_2c0._8_8_ = local_2c0._8_8_ * 0x13;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = local_2a0._8_8_;
      auVar386._8_8_ = 0;
      auVar386._0_8_ = local_2c0._8_8_;
      auVar112._8_8_ = 0;
      auVar112._0_8_ = local_2a0._8_8_;
      auVar387._8_8_ = 0;
      auVar387._0_8_ = local_2b0._0_8_;
      auVar113._8_8_ = 0;
      auVar113._0_8_ = local_2a0._8_8_;
      auVar388._8_8_ = 0;
      auVar388._0_8_ = local_2d0._0_8_;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = local_2a0._8_8_;
      auVar389._8_8_ = 0;
      auVar389._0_8_ = local_2d0._8_8_;
      auVar115._8_8_ = 0;
      auVar115._0_8_ = local_2a0._8_8_;
      auVar390._8_8_ = 0;
      auVar390._0_8_ = local_2c0._0_8_;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = local_290._0_8_;
      auVar391._8_8_ = 0;
      auVar391._0_8_ = local_2c0._0_8_ * 0x13;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = local_290._0_8_;
      auVar392._8_8_ = 0;
      auVar392._0_8_ = local_2c0._8_8_;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = local_290._0_8_;
      auVar393._8_8_ = 0;
      auVar393._0_8_ = local_2b0._0_8_;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = local_290._0_8_;
      auVar394._8_8_ = 0;
      auVar394._0_8_ = local_2d0._0_8_;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = local_290._0_8_;
      auVar395._8_8_ = 0;
      auVar395._0_8_ = local_2d0._8_8_;
      auVar121._8_8_ = 0;
      auVar121._0_8_ = local_290._8_8_;
      auVar396._8_8_ = 0;
      auVar396._0_8_ = local_2d0._8_8_ * 0x13;
      auVar2 = auVar106 * auVar381 + auVar101 * auVar376 + auVar111 * auVar386 + auVar116 * auVar391
               + auVar121 * auVar396;
      auVar122._8_8_ = 0;
      auVar122._0_8_ = local_290._8_8_;
      auVar397._8_8_ = 0;
      auVar397._0_8_ = local_2c0._0_8_ * 0x13;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = local_290._8_8_;
      auVar398._8_8_ = 0;
      auVar398._0_8_ = local_2c0._8_8_;
      auVar124._8_8_ = 0;
      auVar124._0_8_ = local_290._8_8_;
      auVar399._8_8_ = 0;
      auVar399._0_8_ = local_2b0._0_8_;
      auVar125._8_8_ = 0;
      auVar125._0_8_ = local_290._8_8_;
      auVar400._8_8_ = 0;
      auVar400._0_8_ = local_2d0._0_8_;
      auVar3 = auVar107 * auVar382 + auVar102 * auVar377 + auVar112 * auVar387 + auVar117 * auVar392
               + auVar122 * auVar397 + (auVar2 >> 0x33);
      auVar4 = auVar113 * auVar388 + auVar108 * auVar383 + auVar103 * auVar378 + auVar118 * auVar393
               + auVar123 * auVar398 + (auVar3 >> 0x33);
      auVar5 = (auVar4 >> 0x33) +
               auVar124 * auVar399 +
               auVar114 * auVar389 + auVar104 * auVar379 + auVar109 * auVar384 + auVar119 * auVar394
      ;
      local_2c0._8_8_ = auVar5._0_8_;
      uVar568 = auVar5._8_8_;
      auVar553._8_8_ = uVar568 >> 0x33;
      auVar553._0_8_ = uVar568 * 0x2000 | (ulong)local_2c0._8_8_ >> 0x33;
      auVar553 = auVar125 * auVar400 +
                 auVar120 * auVar395 +
                 auVar115 * auVar390 + auVar110 * auVar385 + auVar105 * auVar380 + auVar553;
      local_260 = auVar553._0_8_;
      local_2d0._0_8_ =
           (auVar553._8_8_ << 0xd | local_260 >> 0x33) * 0x13 + (auVar2._0_8_ & 0x7ffffffffffff);
      local_2c0._0_8_ = auVar4._0_8_ & 0x7ffffffffffff;
      local_2c0._8_8_ = local_2c0._8_8_ & 0x7ffffffffffff;
      local_2d0._8_8_ = ((ulong)local_2d0._0_8_ >> 0x33) + (auVar3._0_8_ & 0x7ffffffffffff);
      local_260 = local_260 & 0x7ffffffffffff;
      local_2d0._0_8_ = local_2d0._0_8_ & 0x7ffffffffffff;
      local_178 = ZEXT816(0);
      local_188 = ZEXT816(0);
      local_198 = ZEXT816(0);
      local_1a8 = ZEXT816(0);
      local_1b8 = ZEXT816(0);
      local_280._0_8_ = local_2d0._0_8_;
      local_280._8_8_ = local_2d0._8_8_;
      local_270._0_8_ = local_2c0._0_8_;
      local_270._8_8_ = local_2c0._8_8_;
      local_2b0._0_8_ = local_260;
      Hacl_Bignum_Fsquare_fsquare_times_((uint64_t *)local_2d0,(FStar_UInt128_t *)local_1b8,0x14);
      auVar126._8_8_ = 0;
      auVar126._0_8_ = local_280._0_8_;
      auVar401._8_8_ = 0;
      auVar401._0_8_ = local_2d0._0_8_;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = local_280._0_8_;
      auVar402._8_8_ = 0;
      auVar402._0_8_ = local_2d0._8_8_;
      auVar128._8_8_ = 0;
      auVar128._0_8_ = local_280._0_8_;
      auVar403._8_8_ = 0;
      auVar403._0_8_ = local_2c0._0_8_;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = local_280._0_8_;
      auVar404._8_8_ = 0;
      auVar404._0_8_ = local_2c0._8_8_;
      auVar130._8_8_ = 0;
      auVar130._0_8_ = local_280._0_8_;
      auVar405._8_8_ = 0;
      auVar405._0_8_ = local_2b0._0_8_;
      local_2b0._0_8_ = local_2b0._0_8_ * 0x13;
      auVar131._8_8_ = 0;
      auVar131._0_8_ = local_280._8_8_;
      auVar406._8_8_ = 0;
      auVar406._0_8_ = local_2b0._0_8_;
      auVar132._8_8_ = 0;
      auVar132._0_8_ = local_280._8_8_;
      auVar407._8_8_ = 0;
      auVar407._0_8_ = local_2d0._0_8_;
      auVar133._8_8_ = 0;
      auVar133._0_8_ = local_280._8_8_;
      auVar408._8_8_ = 0;
      auVar408._0_8_ = local_2d0._8_8_;
      auVar134._8_8_ = 0;
      auVar134._0_8_ = local_280._8_8_;
      auVar409._8_8_ = 0;
      auVar409._0_8_ = local_2c0._0_8_;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = local_280._8_8_;
      auVar410._8_8_ = 0;
      auVar410._0_8_ = local_2c0._8_8_;
      local_2c0._8_8_ = local_2c0._8_8_ * 0x13;
      auVar136._8_8_ = 0;
      auVar136._0_8_ = local_270._0_8_;
      auVar411._8_8_ = 0;
      auVar411._0_8_ = local_2c0._8_8_;
      auVar137._8_8_ = 0;
      auVar137._0_8_ = local_270._0_8_;
      auVar412._8_8_ = 0;
      auVar412._0_8_ = local_2b0._0_8_;
      auVar138._8_8_ = 0;
      auVar138._0_8_ = local_270._0_8_;
      auVar413._8_8_ = 0;
      auVar413._0_8_ = local_2d0._0_8_;
      auVar139._8_8_ = 0;
      auVar139._0_8_ = local_270._0_8_;
      auVar414._8_8_ = 0;
      auVar414._0_8_ = local_2d0._8_8_;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = local_270._0_8_;
      auVar415._8_8_ = 0;
      auVar415._0_8_ = local_2c0._0_8_;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = local_270._8_8_;
      auVar416._8_8_ = 0;
      auVar416._0_8_ = local_2c0._0_8_ * 0x13;
      auVar142._8_8_ = 0;
      auVar142._0_8_ = local_270._8_8_;
      auVar417._8_8_ = 0;
      auVar417._0_8_ = local_2c0._8_8_;
      auVar143._8_8_ = 0;
      auVar143._0_8_ = local_270._8_8_;
      auVar418._8_8_ = 0;
      auVar418._0_8_ = local_2b0._0_8_;
      auVar144._8_8_ = 0;
      auVar144._0_8_ = local_270._8_8_;
      auVar419._8_8_ = 0;
      auVar419._0_8_ = local_2d0._0_8_;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = local_270._8_8_;
      auVar420._8_8_ = 0;
      auVar420._0_8_ = local_2d0._8_8_;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = local_260;
      auVar421._8_8_ = 0;
      auVar421._0_8_ = local_2d0._8_8_ * 0x13;
      auVar2 = auVar131 * auVar406 + auVar126 * auVar401 + auVar136 * auVar411 + auVar141 * auVar416
               + auVar146 * auVar421;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = local_260;
      auVar422._8_8_ = 0;
      auVar422._0_8_ = local_2c0._0_8_ * 0x13;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = local_260;
      auVar423._8_8_ = 0;
      auVar423._0_8_ = local_2c0._8_8_;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = local_260;
      auVar424._8_8_ = 0;
      auVar424._0_8_ = local_2b0._0_8_;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = local_260;
      auVar425._8_8_ = 0;
      auVar425._0_8_ = local_2d0._0_8_;
      auVar3 = auVar132 * auVar407 + auVar127 * auVar402 + auVar137 * auVar412 + auVar142 * auVar417
               + auVar147 * auVar422 + (auVar2 >> 0x33);
      auVar4 = auVar138 * auVar413 + auVar133 * auVar408 + auVar128 * auVar403 + auVar143 * auVar418
               + auVar148 * auVar423 + (auVar3 >> 0x33);
      auVar5 = (auVar4 >> 0x33) +
               auVar149 * auVar424 +
               auVar139 * auVar414 + auVar134 * auVar409 + auVar129 * auVar404 + auVar144 * auVar419
      ;
      local_2c0._8_8_ = auVar5._0_8_;
      uVar568 = auVar5._8_8_;
      auVar554._8_8_ = uVar568 >> 0x33;
      auVar554._0_8_ = uVar568 * 0x2000 | (ulong)local_2c0._8_8_ >> 0x33;
      auVar554 = auVar150 * auVar425 +
                 auVar145 * auVar420 +
                 auVar140 * auVar415 + auVar135 * auVar410 + auVar130 * auVar405 + auVar554;
      local_2b0._0_8_ = auVar554._0_8_;
      local_2d0._0_8_ =
           (auVar554._8_8_ << 0xd | (ulong)local_2b0._0_8_ >> 0x33) * 0x13 +
           (auVar2._0_8_ & 0x7ffffffffffff);
      local_2c0._0_8_ = auVar4._0_8_ & 0x7ffffffffffff;
      local_2c0._8_8_ = local_2c0._8_8_ & 0x7ffffffffffff;
      local_2b0._0_8_ = local_2b0._0_8_ & 0x7ffffffffffff;
      local_2d0._8_8_ = ((ulong)local_2d0._0_8_ >> 0x33) + (auVar3._0_8_ & 0x7ffffffffffff);
      local_2d0._0_8_ = local_2d0._0_8_ & 0x7ffffffffffff;
      local_178 = ZEXT816(0);
      local_188 = ZEXT816(0);
      local_198 = ZEXT816(0);
      local_1a8 = ZEXT816(0);
      local_1b8 = ZEXT816(0);
      Hacl_Bignum_Fsquare_fsquare_times_((uint64_t *)local_2d0,(FStar_UInt128_t *)local_1b8,10);
      auVar151._8_8_ = 0;
      auVar151._0_8_ = local_2b0._8_8_;
      auVar426._8_8_ = 0;
      auVar426._0_8_ = local_2d0._0_8_;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = local_2b0._8_8_;
      auVar427._8_8_ = 0;
      auVar427._0_8_ = local_2d0._8_8_;
      auVar153._8_8_ = 0;
      auVar153._0_8_ = local_2b0._8_8_;
      auVar428._8_8_ = 0;
      auVar428._0_8_ = local_2c0._0_8_;
      auVar154._8_8_ = 0;
      auVar154._0_8_ = local_2b0._8_8_;
      auVar429._8_8_ = 0;
      auVar429._0_8_ = local_2c0._8_8_;
      auVar155._8_8_ = 0;
      auVar155._0_8_ = local_2b0._8_8_;
      auVar430._8_8_ = 0;
      auVar430._0_8_ = local_2b0._0_8_;
      local_2b0._0_8_ = local_2b0._0_8_ * 0x13;
      auVar156._8_8_ = 0;
      auVar156._0_8_ = local_2a0._0_8_;
      auVar431._8_8_ = 0;
      auVar431._0_8_ = local_2b0._0_8_;
      auVar157._8_8_ = 0;
      auVar157._0_8_ = local_2a0._0_8_;
      auVar432._8_8_ = 0;
      auVar432._0_8_ = local_2d0._0_8_;
      auVar158._8_8_ = 0;
      auVar158._0_8_ = local_2a0._0_8_;
      auVar433._8_8_ = 0;
      auVar433._0_8_ = local_2d0._8_8_;
      auVar159._8_8_ = 0;
      auVar159._0_8_ = local_2a0._0_8_;
      auVar434._8_8_ = 0;
      auVar434._0_8_ = local_2c0._0_8_;
      auVar160._8_8_ = 0;
      auVar160._0_8_ = local_2a0._0_8_;
      auVar435._8_8_ = 0;
      auVar435._0_8_ = local_2c0._8_8_;
      local_2c0._8_8_ = local_2c0._8_8_ * 0x13;
      auVar161._8_8_ = 0;
      auVar161._0_8_ = local_2a0._8_8_;
      auVar436._8_8_ = 0;
      auVar436._0_8_ = local_2c0._8_8_;
      auVar162._8_8_ = 0;
      auVar162._0_8_ = local_2a0._8_8_;
      auVar437._8_8_ = 0;
      auVar437._0_8_ = local_2b0._0_8_;
      auVar163._8_8_ = 0;
      auVar163._0_8_ = local_2a0._8_8_;
      auVar438._8_8_ = 0;
      auVar438._0_8_ = local_2d0._0_8_;
      auVar164._8_8_ = 0;
      auVar164._0_8_ = local_2a0._8_8_;
      auVar439._8_8_ = 0;
      auVar439._0_8_ = local_2d0._8_8_;
      auVar165._8_8_ = 0;
      auVar165._0_8_ = local_2a0._8_8_;
      auVar440._8_8_ = 0;
      auVar440._0_8_ = local_2c0._0_8_;
      auVar166._8_8_ = 0;
      auVar166._0_8_ = local_290._0_8_;
      auVar441._8_8_ = 0;
      auVar441._0_8_ = local_2c0._0_8_ * 0x13;
      auVar167._8_8_ = 0;
      auVar167._0_8_ = local_290._0_8_;
      auVar442._8_8_ = 0;
      auVar442._0_8_ = local_2c0._8_8_;
      auVar168._8_8_ = 0;
      auVar168._0_8_ = local_290._0_8_;
      auVar443._8_8_ = 0;
      auVar443._0_8_ = local_2b0._0_8_;
      auVar169._8_8_ = 0;
      auVar169._0_8_ = local_290._0_8_;
      auVar444._8_8_ = 0;
      auVar444._0_8_ = local_2d0._0_8_;
      auVar170._8_8_ = 0;
      auVar170._0_8_ = local_290._0_8_;
      auVar445._8_8_ = 0;
      auVar445._0_8_ = local_2d0._8_8_;
      auVar171._8_8_ = 0;
      auVar171._0_8_ = local_290._8_8_;
      auVar446._8_8_ = 0;
      auVar446._0_8_ = local_2d0._8_8_ * 0x13;
      auVar2 = auVar156 * auVar431 + auVar151 * auVar426 + auVar161 * auVar436 + auVar166 * auVar441
               + auVar171 * auVar446;
      auVar172._8_8_ = 0;
      auVar172._0_8_ = local_290._8_8_;
      auVar447._8_8_ = 0;
      auVar447._0_8_ = local_2c0._0_8_ * 0x13;
      auVar173._8_8_ = 0;
      auVar173._0_8_ = local_290._8_8_;
      auVar448._8_8_ = 0;
      auVar448._0_8_ = local_2c0._8_8_;
      auVar174._8_8_ = 0;
      auVar174._0_8_ = local_290._8_8_;
      auVar449._8_8_ = 0;
      auVar449._0_8_ = local_2b0._0_8_;
      auVar175._8_8_ = 0;
      auVar175._0_8_ = local_290._8_8_;
      auVar450._8_8_ = 0;
      auVar450._0_8_ = local_2d0._0_8_;
      auVar3 = auVar157 * auVar432 + auVar152 * auVar427 + auVar162 * auVar437 + auVar167 * auVar442
               + auVar172 * auVar447 + (auVar2 >> 0x33);
      auVar4 = auVar163 * auVar438 + auVar158 * auVar433 + auVar153 * auVar428 + auVar168 * auVar443
               + auVar173 * auVar448 + (auVar3 >> 0x33);
      auVar5 = (auVar4 >> 0x33) +
               auVar174 * auVar449 +
               auVar164 * auVar439 + auVar154 * auVar429 + auVar159 * auVar434 + auVar169 * auVar444
      ;
      local_2c0._8_8_ = auVar5._0_8_;
      uVar568 = auVar5._8_8_;
      auVar555._8_8_ = uVar568 >> 0x33;
      auVar555._0_8_ = uVar568 * 0x2000 | (ulong)local_2c0._8_8_ >> 0x33;
      auVar555 = auVar175 * auVar450 +
                 auVar170 * auVar445 +
                 auVar165 * auVar440 + auVar160 * auVar435 + auVar155 * auVar430 + auVar555;
      local_2b0._0_8_ = auVar555._0_8_;
      local_2d0._0_8_ =
           (auVar555._8_8_ << 0xd | (ulong)local_2b0._0_8_ >> 0x33) * 0x13 +
           (auVar2._0_8_ & 0x7ffffffffffff);
      local_2c0._0_8_ = auVar4._0_8_ & 0x7ffffffffffff;
      local_2c0._8_8_ = local_2c0._8_8_ & 0x7ffffffffffff;
      local_2d0._8_8_ = ((ulong)local_2d0._0_8_ >> 0x33) + (auVar3._0_8_ & 0x7ffffffffffff);
      local_2b0._0_8_ = local_2b0._0_8_ & 0x7ffffffffffff;
      local_290._8_8_ = local_2b0._0_8_;
      local_290._0_8_ = local_2c0._8_8_;
      local_2d0._0_8_ = local_2d0._0_8_ & 0x7ffffffffffff;
      local_2a0._8_8_ = local_2c0._0_8_;
      local_2a0._0_8_ = local_2d0._8_8_;
      local_178 = ZEXT816(0);
      local_188 = ZEXT816(0);
      local_198 = ZEXT816(0);
      local_1a8 = ZEXT816(0);
      local_1b8 = ZEXT816(0);
      local_2b0._8_8_ = local_2d0._0_8_;
      Hacl_Bignum_Fsquare_fsquare_times_((uint64_t *)local_2d0,(FStar_UInt128_t *)local_1b8,0x32);
      local_178 = ZEXT816(0);
      local_188 = ZEXT816(0);
      local_198 = ZEXT816(0);
      local_1a8 = ZEXT816(0);
      local_1b8 = ZEXT816(0);
      uStack_2f0 = uStack_250;
      local_2f8 = local_258;
      uStack_2e0 = uStack_240;
      local_2e8 = local_248;
      local_2d8 = local_238;
      Hacl_Bignum_Fsquare_fsquare_times_(&local_2f8,(FStar_UInt128_t *)local_1b8,1);
      auVar176._8_8_ = 0;
      auVar176._0_8_ = local_2b0._8_8_;
      auVar451._8_8_ = 0;
      auVar451._0_8_ = local_2d0._0_8_;
      auVar177._8_8_ = 0;
      auVar177._0_8_ = local_2b0._8_8_;
      auVar452._8_8_ = 0;
      auVar452._0_8_ = local_2d0._8_8_;
      auVar178._8_8_ = 0;
      auVar178._0_8_ = local_2b0._8_8_;
      auVar453._8_8_ = 0;
      auVar453._0_8_ = local_2c0._0_8_;
      auVar179._8_8_ = 0;
      auVar179._0_8_ = local_2b0._8_8_;
      auVar454._8_8_ = 0;
      auVar454._0_8_ = local_2c0._8_8_;
      auVar180._8_8_ = 0;
      auVar180._0_8_ = local_2b0._8_8_;
      auVar455._8_8_ = 0;
      auVar455._0_8_ = local_2b0._0_8_;
      local_2b0._0_8_ = local_2b0._0_8_ * 0x13;
      auVar181._8_8_ = 0;
      auVar181._0_8_ = local_2a0._0_8_;
      auVar456._8_8_ = 0;
      auVar456._0_8_ = local_2b0._0_8_;
      auVar182._8_8_ = 0;
      auVar182._0_8_ = local_2a0._0_8_;
      auVar457._8_8_ = 0;
      auVar457._0_8_ = local_2d0._0_8_;
      auVar183._8_8_ = 0;
      auVar183._0_8_ = local_2a0._0_8_;
      auVar458._8_8_ = 0;
      auVar458._0_8_ = local_2d0._8_8_;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = local_2a0._0_8_;
      auVar459._8_8_ = 0;
      auVar459._0_8_ = local_2c0._0_8_;
      auVar185._8_8_ = 0;
      auVar185._0_8_ = local_2a0._0_8_;
      auVar460._8_8_ = 0;
      auVar460._0_8_ = local_2c0._8_8_;
      local_2c0._8_8_ = local_2c0._8_8_ * 0x13;
      auVar186._8_8_ = 0;
      auVar186._0_8_ = local_2a0._8_8_;
      auVar461._8_8_ = 0;
      auVar461._0_8_ = local_2c0._8_8_;
      auVar187._8_8_ = 0;
      auVar187._0_8_ = local_2a0._8_8_;
      auVar462._8_8_ = 0;
      auVar462._0_8_ = local_2b0._0_8_;
      auVar188._8_8_ = 0;
      auVar188._0_8_ = local_2a0._8_8_;
      auVar463._8_8_ = 0;
      auVar463._0_8_ = local_2d0._0_8_;
      auVar189._8_8_ = 0;
      auVar189._0_8_ = local_2a0._8_8_;
      auVar464._8_8_ = 0;
      auVar464._0_8_ = local_2d0._8_8_;
      auVar190._8_8_ = 0;
      auVar190._0_8_ = local_2a0._8_8_;
      auVar465._8_8_ = 0;
      auVar465._0_8_ = local_2c0._0_8_;
      auVar191._8_8_ = 0;
      auVar191._0_8_ = local_290._0_8_;
      auVar466._8_8_ = 0;
      auVar466._0_8_ = local_2c0._0_8_ * 0x13;
      auVar192._8_8_ = 0;
      auVar192._0_8_ = local_290._0_8_;
      auVar467._8_8_ = 0;
      auVar467._0_8_ = local_2c0._8_8_;
      auVar193._8_8_ = 0;
      auVar193._0_8_ = local_290._0_8_;
      auVar468._8_8_ = 0;
      auVar468._0_8_ = local_2b0._0_8_;
      auVar194._8_8_ = 0;
      auVar194._0_8_ = local_290._0_8_;
      auVar469._8_8_ = 0;
      auVar469._0_8_ = local_2d0._0_8_;
      auVar195._8_8_ = 0;
      auVar195._0_8_ = local_290._0_8_;
      auVar470._8_8_ = 0;
      auVar470._0_8_ = local_2d0._8_8_;
      auVar196._8_8_ = 0;
      auVar196._0_8_ = local_290._8_8_;
      auVar471._8_8_ = 0;
      auVar471._0_8_ = local_2d0._8_8_ * 0x13;
      auVar2 = auVar181 * auVar456 + auVar176 * auVar451 + auVar186 * auVar461 + auVar191 * auVar466
               + auVar196 * auVar471;
      auVar197._8_8_ = 0;
      auVar197._0_8_ = local_290._8_8_;
      auVar472._8_8_ = 0;
      auVar472._0_8_ = local_2c0._0_8_ * 0x13;
      auVar198._8_8_ = 0;
      auVar198._0_8_ = local_290._8_8_;
      auVar473._8_8_ = 0;
      auVar473._0_8_ = local_2c0._8_8_;
      auVar199._8_8_ = 0;
      auVar199._0_8_ = local_290._8_8_;
      auVar474._8_8_ = 0;
      auVar474._0_8_ = local_2b0._0_8_;
      auVar200._8_8_ = 0;
      auVar200._0_8_ = local_290._8_8_;
      auVar475._8_8_ = 0;
      auVar475._0_8_ = local_2d0._0_8_;
      auVar3 = auVar182 * auVar457 + auVar177 * auVar452 + auVar187 * auVar462 + auVar192 * auVar467
               + auVar197 * auVar472 + (auVar2 >> 0x33);
      auVar4 = auVar188 * auVar463 + auVar183 * auVar458 + auVar178 * auVar453 + auVar193 * auVar468
               + auVar198 * auVar473 + (auVar3 >> 0x33);
      auVar5 = (auVar4 >> 0x33) +
               auVar199 * auVar474 +
               auVar189 * auVar464 + auVar179 * auVar454 + auVar184 * auVar459 + auVar194 * auVar469
      ;
      local_2c0._8_8_ = auVar5._0_8_;
      uVar568 = auVar5._8_8_;
      auVar556._8_8_ = uVar568 >> 0x33;
      auVar556._0_8_ = uVar568 * 0x2000 | (ulong)local_2c0._8_8_ >> 0x33;
      auVar556 = auVar200 * auVar475 +
                 auVar195 * auVar470 +
                 auVar190 * auVar465 + auVar185 * auVar460 + auVar180 * auVar455 + auVar556;
      local_260 = auVar556._0_8_;
      local_2d0._0_8_ =
           (auVar556._8_8_ << 0xd | local_260 >> 0x33) * 0x13 + (auVar2._0_8_ & 0x7ffffffffffff);
      local_2c0._0_8_ = auVar4._0_8_ & 0x7ffffffffffff;
      local_2c0._8_8_ = local_2c0._8_8_ & 0x7ffffffffffff;
      local_270._8_8_ = local_2c0._8_8_;
      local_270._0_8_ = local_2c0._0_8_;
      local_2d0._8_8_ = ((ulong)local_2d0._0_8_ >> 0x33) + (auVar3._0_8_ & 0x7ffffffffffff);
      local_260 = local_260 & 0x7ffffffffffff;
      local_2d0._0_8_ = local_2d0._0_8_ & 0x7ffffffffffff;
      local_280._8_8_ = local_2d0._8_8_;
      local_280._0_8_ = local_2d0._0_8_;
      local_178 = ZEXT816(0);
      local_188 = ZEXT816(0);
      local_198 = ZEXT816(0);
      local_1a8 = ZEXT816(0);
      local_1b8 = ZEXT816(0);
      local_2b0._0_8_ = local_260;
      Hacl_Bignum_Fsquare_fsquare_times_((uint64_t *)local_2d0,(FStar_UInt128_t *)local_1b8,100);
      auVar201._8_8_ = 0;
      auVar201._0_8_ = local_280._0_8_;
      auVar476._8_8_ = 0;
      auVar476._0_8_ = local_2d0._0_8_;
      auVar202._8_8_ = 0;
      auVar202._0_8_ = local_280._0_8_;
      auVar477._8_8_ = 0;
      auVar477._0_8_ = local_2d0._8_8_;
      auVar203._8_8_ = 0;
      auVar203._0_8_ = local_280._0_8_;
      auVar478._8_8_ = 0;
      auVar478._0_8_ = local_2c0._0_8_;
      auVar204._8_8_ = 0;
      auVar204._0_8_ = local_280._0_8_;
      auVar479._8_8_ = 0;
      auVar479._0_8_ = local_2c0._8_8_;
      auVar205._8_8_ = 0;
      auVar205._0_8_ = local_280._0_8_;
      auVar480._8_8_ = 0;
      auVar480._0_8_ = local_2b0._0_8_;
      local_2b0._0_8_ = local_2b0._0_8_ * 0x13;
      auVar206._8_8_ = 0;
      auVar206._0_8_ = local_280._8_8_;
      auVar481._8_8_ = 0;
      auVar481._0_8_ = local_2b0._0_8_;
      auVar207._8_8_ = 0;
      auVar207._0_8_ = local_280._8_8_;
      auVar482._8_8_ = 0;
      auVar482._0_8_ = local_2d0._0_8_;
      auVar208._8_8_ = 0;
      auVar208._0_8_ = local_280._8_8_;
      auVar483._8_8_ = 0;
      auVar483._0_8_ = local_2d0._8_8_;
      auVar209._8_8_ = 0;
      auVar209._0_8_ = local_280._8_8_;
      auVar484._8_8_ = 0;
      auVar484._0_8_ = local_2c0._0_8_;
      auVar210._8_8_ = 0;
      auVar210._0_8_ = local_280._8_8_;
      auVar485._8_8_ = 0;
      auVar485._0_8_ = local_2c0._8_8_;
      local_2c0._8_8_ = local_2c0._8_8_ * 0x13;
      auVar211._8_8_ = 0;
      auVar211._0_8_ = local_270._0_8_;
      auVar486._8_8_ = 0;
      auVar486._0_8_ = local_2c0._8_8_;
      auVar212._8_8_ = 0;
      auVar212._0_8_ = local_270._0_8_;
      auVar487._8_8_ = 0;
      auVar487._0_8_ = local_2b0._0_8_;
      auVar213._8_8_ = 0;
      auVar213._0_8_ = local_270._0_8_;
      auVar488._8_8_ = 0;
      auVar488._0_8_ = local_2d0._0_8_;
      auVar214._8_8_ = 0;
      auVar214._0_8_ = local_270._0_8_;
      auVar489._8_8_ = 0;
      auVar489._0_8_ = local_2d0._8_8_;
      auVar215._8_8_ = 0;
      auVar215._0_8_ = local_270._0_8_;
      auVar490._8_8_ = 0;
      auVar490._0_8_ = local_2c0._0_8_;
      auVar216._8_8_ = 0;
      auVar216._0_8_ = local_270._8_8_;
      auVar491._8_8_ = 0;
      auVar491._0_8_ = local_2c0._0_8_ * 0x13;
      auVar217._8_8_ = 0;
      auVar217._0_8_ = local_270._8_8_;
      auVar492._8_8_ = 0;
      auVar492._0_8_ = local_2c0._8_8_;
      auVar218._8_8_ = 0;
      auVar218._0_8_ = local_270._8_8_;
      auVar493._8_8_ = 0;
      auVar493._0_8_ = local_2b0._0_8_;
      auVar219._8_8_ = 0;
      auVar219._0_8_ = local_270._8_8_;
      auVar494._8_8_ = 0;
      auVar494._0_8_ = local_2d0._0_8_;
      auVar220._8_8_ = 0;
      auVar220._0_8_ = local_270._8_8_;
      auVar495._8_8_ = 0;
      auVar495._0_8_ = local_2d0._8_8_;
      auVar221._8_8_ = 0;
      auVar221._0_8_ = local_260;
      auVar496._8_8_ = 0;
      auVar496._0_8_ = local_2d0._8_8_ * 0x13;
      auVar2 = auVar206 * auVar481 + auVar201 * auVar476 + auVar211 * auVar486 + auVar216 * auVar491
               + auVar221 * auVar496;
      auVar222._8_8_ = 0;
      auVar222._0_8_ = local_260;
      auVar497._8_8_ = 0;
      auVar497._0_8_ = local_2c0._0_8_ * 0x13;
      auVar223._8_8_ = 0;
      auVar223._0_8_ = local_260;
      auVar498._8_8_ = 0;
      auVar498._0_8_ = local_2c0._8_8_;
      auVar224._8_8_ = 0;
      auVar224._0_8_ = local_260;
      auVar499._8_8_ = 0;
      auVar499._0_8_ = local_2b0._0_8_;
      auVar225._8_8_ = 0;
      auVar225._0_8_ = local_260;
      auVar500._8_8_ = 0;
      auVar500._0_8_ = local_2d0._0_8_;
      auVar3 = auVar207 * auVar482 + auVar202 * auVar477 + auVar212 * auVar487 + auVar217 * auVar492
               + auVar222 * auVar497 + (auVar2 >> 0x33);
      auVar4 = auVar213 * auVar488 + auVar208 * auVar483 + auVar203 * auVar478 + auVar218 * auVar493
               + auVar223 * auVar498 + (auVar3 >> 0x33);
      auVar5 = (auVar4 >> 0x33) +
               auVar224 * auVar499 +
               auVar214 * auVar489 + auVar209 * auVar484 + auVar204 * auVar479 + auVar219 * auVar494
      ;
      local_2c0._8_8_ = auVar5._0_8_;
      uVar568 = auVar5._8_8_;
      auVar557._8_8_ = uVar568 >> 0x33;
      auVar557._0_8_ = uVar568 * 0x2000 | (ulong)local_2c0._8_8_ >> 0x33;
      auVar557 = auVar225 * auVar500 +
                 auVar220 * auVar495 +
                 auVar215 * auVar490 + auVar210 * auVar485 + auVar205 * auVar480 + auVar557;
      local_2b0._0_8_ = auVar557._0_8_;
      local_2d0._0_8_ =
           (auVar557._8_8_ << 0xd | (ulong)local_2b0._0_8_ >> 0x33) * 0x13 +
           (auVar2._0_8_ & 0x7ffffffffffff);
      local_2c0._0_8_ = auVar4._0_8_ & 0x7ffffffffffff;
      local_2c0._8_8_ = local_2c0._8_8_ & 0x7ffffffffffff;
      local_2b0._0_8_ = local_2b0._0_8_ & 0x7ffffffffffff;
      local_2d0._8_8_ = ((ulong)local_2d0._0_8_ >> 0x33) + (auVar3._0_8_ & 0x7ffffffffffff);
      local_2d0._0_8_ = local_2d0._0_8_ & 0x7ffffffffffff;
      local_178 = ZEXT816(0);
      local_188 = ZEXT816(0);
      local_198 = ZEXT816(0);
      local_1a8 = ZEXT816(0);
      local_1b8 = ZEXT816(0);
      Hacl_Bignum_Fsquare_fsquare_times_((uint64_t *)local_2d0,(FStar_UInt128_t *)local_1b8,0x32);
      auVar226._8_8_ = 0;
      auVar226._0_8_ = local_2b0._8_8_;
      auVar501._8_8_ = 0;
      auVar501._0_8_ = local_2d0._0_8_;
      auVar227._8_8_ = 0;
      auVar227._0_8_ = local_2b0._8_8_;
      auVar502._8_8_ = 0;
      auVar502._0_8_ = local_2d0._8_8_;
      auVar228._8_8_ = 0;
      auVar228._0_8_ = local_2b0._8_8_;
      auVar503._8_8_ = 0;
      auVar503._0_8_ = local_2c0._0_8_;
      auVar229._8_8_ = 0;
      auVar229._0_8_ = local_2b0._8_8_;
      auVar504._8_8_ = 0;
      auVar504._0_8_ = local_2c0._8_8_;
      auVar230._8_8_ = 0;
      auVar230._0_8_ = local_2b0._8_8_;
      auVar505._8_8_ = 0;
      auVar505._0_8_ = local_2b0._0_8_;
      local_2b0._0_8_ = local_2b0._0_8_ * 0x13;
      auVar231._8_8_ = 0;
      auVar231._0_8_ = local_2a0._0_8_;
      auVar506._8_8_ = 0;
      auVar506._0_8_ = local_2b0._0_8_;
      auVar232._8_8_ = 0;
      auVar232._0_8_ = local_2a0._0_8_;
      auVar507._8_8_ = 0;
      auVar507._0_8_ = local_2d0._0_8_;
      auVar233._8_8_ = 0;
      auVar233._0_8_ = local_2a0._0_8_;
      auVar508._8_8_ = 0;
      auVar508._0_8_ = local_2d0._8_8_;
      auVar234._8_8_ = 0;
      auVar234._0_8_ = local_2a0._0_8_;
      auVar509._8_8_ = 0;
      auVar509._0_8_ = local_2c0._0_8_;
      auVar235._8_8_ = 0;
      auVar235._0_8_ = local_2a0._0_8_;
      auVar510._8_8_ = 0;
      auVar510._0_8_ = local_2c0._8_8_;
      local_2c0._8_8_ = local_2c0._8_8_ * 0x13;
      auVar236._8_8_ = 0;
      auVar236._0_8_ = local_2a0._8_8_;
      auVar511._8_8_ = 0;
      auVar511._0_8_ = local_2c0._8_8_;
      auVar237._8_8_ = 0;
      auVar237._0_8_ = local_2a0._8_8_;
      auVar512._8_8_ = 0;
      auVar512._0_8_ = local_2b0._0_8_;
      auVar238._8_8_ = 0;
      auVar238._0_8_ = local_2a0._8_8_;
      auVar513._8_8_ = 0;
      auVar513._0_8_ = local_2d0._0_8_;
      auVar239._8_8_ = 0;
      auVar239._0_8_ = local_2a0._8_8_;
      auVar514._8_8_ = 0;
      auVar514._0_8_ = local_2d0._8_8_;
      auVar240._8_8_ = 0;
      auVar240._0_8_ = local_2a0._8_8_;
      auVar515._8_8_ = 0;
      auVar515._0_8_ = local_2c0._0_8_;
      auVar241._8_8_ = 0;
      auVar241._0_8_ = local_290._0_8_;
      auVar516._8_8_ = 0;
      auVar516._0_8_ = local_2c0._0_8_ * 0x13;
      auVar242._8_8_ = 0;
      auVar242._0_8_ = local_290._0_8_;
      auVar517._8_8_ = 0;
      auVar517._0_8_ = local_2c0._8_8_;
      auVar243._8_8_ = 0;
      auVar243._0_8_ = local_290._0_8_;
      auVar518._8_8_ = 0;
      auVar518._0_8_ = local_2b0._0_8_;
      auVar244._8_8_ = 0;
      auVar244._0_8_ = local_290._0_8_;
      auVar519._8_8_ = 0;
      auVar519._0_8_ = local_2d0._0_8_;
      auVar245._8_8_ = 0;
      auVar245._0_8_ = local_290._0_8_;
      auVar520._8_8_ = 0;
      auVar520._0_8_ = local_2d0._8_8_;
      auVar246._8_8_ = 0;
      auVar246._0_8_ = local_290._8_8_;
      auVar521._8_8_ = 0;
      auVar521._0_8_ = local_2d0._8_8_ * 0x13;
      auVar2 = auVar231 * auVar506 + auVar226 * auVar501 + auVar236 * auVar511 + auVar241 * auVar516
               + auVar246 * auVar521;
      auVar247._8_8_ = 0;
      auVar247._0_8_ = local_290._8_8_;
      auVar522._8_8_ = 0;
      auVar522._0_8_ = local_2c0._0_8_ * 0x13;
      auVar248._8_8_ = 0;
      auVar248._0_8_ = local_290._8_8_;
      auVar523._8_8_ = 0;
      auVar523._0_8_ = local_2c0._8_8_;
      auVar249._8_8_ = 0;
      auVar249._0_8_ = local_290._8_8_;
      auVar524._8_8_ = 0;
      auVar524._0_8_ = local_2b0._0_8_;
      auVar250._8_8_ = 0;
      auVar250._0_8_ = local_290._8_8_;
      auVar525._8_8_ = 0;
      auVar525._0_8_ = local_2d0._0_8_;
      auVar3 = auVar232 * auVar507 + auVar227 * auVar502 + auVar237 * auVar512 + auVar242 * auVar517
               + auVar247 * auVar522 + (auVar2 >> 0x33);
      auVar4 = auVar238 * auVar513 + auVar233 * auVar508 + auVar228 * auVar503 + auVar243 * auVar518
               + auVar248 * auVar523 + (auVar3 >> 0x33);
      auVar5 = (auVar4 >> 0x33) +
               auVar249 * auVar524 +
               auVar239 * auVar514 + auVar229 * auVar504 + auVar234 * auVar509 + auVar244 * auVar519
      ;
      uVar569 = auVar5._0_8_;
      uVar568 = auVar5._8_8_;
      auVar558._8_8_ = uVar568 >> 0x33;
      auVar558._0_8_ = uVar568 * 0x2000 | uVar569 >> 0x33;
      auVar558 = auVar250 * auVar525 +
                 auVar245 * auVar520 +
                 auVar240 * auVar515 + auVar235 * auVar510 + auVar230 * auVar505 + auVar558;
      uVar571 = auVar558._0_8_;
      uVar568 = (auVar558._8_8_ << 0xd | uVar571 >> 0x33) * 0x13 + (auVar2._0_8_ & 0x7ffffffffffff);
      local_2c0._8_8_ = uVar569 & 0x7ffffffffffff;
      local_2c0._0_8_ = auVar4._0_8_ & 0x7ffffffffffff;
      local_2b0._0_8_ = uVar571 & 0x7ffffffffffff;
      local_2d0._8_8_ = (uVar568 >> 0x33) + (auVar3._0_8_ & 0x7ffffffffffff);
      local_2d0._0_8_ = uVar568 & 0x7ffffffffffff;
      local_178 = ZEXT816(0);
      local_188 = ZEXT816(0);
      local_198 = ZEXT816(0);
      local_1a8 = ZEXT816(0);
      local_1b8 = ZEXT816(0);
      Hacl_Bignum_Fsquare_fsquare_times_((uint64_t *)local_2d0,(FStar_UInt128_t *)local_1b8,2);
      auVar251._8_8_ = 0;
      auVar251._0_8_ = local_2f8;
      auVar526._8_8_ = 0;
      auVar526._0_8_ = local_2d0._0_8_;
      auVar252._8_8_ = 0;
      auVar252._0_8_ = local_2f8;
      auVar527._8_8_ = 0;
      auVar527._0_8_ = local_2d0._8_8_;
      auVar253._8_8_ = 0;
      auVar253._0_8_ = local_2f8;
      auVar528._8_8_ = 0;
      auVar528._0_8_ = local_2c0._0_8_;
      auVar254._8_8_ = 0;
      auVar254._0_8_ = local_2f8;
      auVar529._8_8_ = 0;
      auVar529._0_8_ = local_2c0._8_8_;
      auVar255._8_8_ = 0;
      auVar255._0_8_ = local_2f8;
      auVar530._8_8_ = 0;
      auVar530._0_8_ = local_2b0._0_8_;
      uVar568 = local_2b0._0_8_ * 0x13;
      auVar256._8_8_ = 0;
      auVar256._0_8_ = uStack_2f0;
      auVar531._8_8_ = 0;
      auVar531._0_8_ = uVar568;
      auVar257._8_8_ = 0;
      auVar257._0_8_ = uStack_2f0;
      auVar532._8_8_ = 0;
      auVar532._0_8_ = local_2d0._0_8_;
      auVar258._8_8_ = 0;
      auVar258._0_8_ = uStack_2f0;
      auVar533._8_8_ = 0;
      auVar533._0_8_ = local_2d0._8_8_;
      auVar259._8_8_ = 0;
      auVar259._0_8_ = uStack_2f0;
      auVar534._8_8_ = 0;
      auVar534._0_8_ = local_2c0._0_8_;
      auVar260._8_8_ = 0;
      auVar260._0_8_ = uStack_2f0;
      auVar535._8_8_ = 0;
      auVar535._0_8_ = local_2c0._8_8_;
      uVar569 = local_2c0._8_8_ * 0x13;
      auVar261._8_8_ = 0;
      auVar261._0_8_ = local_2e8;
      auVar536._8_8_ = 0;
      auVar536._0_8_ = uVar569;
      auVar262._8_8_ = 0;
      auVar262._0_8_ = local_2e8;
      auVar537._8_8_ = 0;
      auVar537._0_8_ = uVar568;
      auVar263._8_8_ = 0;
      auVar263._0_8_ = local_2e8;
      auVar538._8_8_ = 0;
      auVar538._0_8_ = local_2d0._0_8_;
      auVar264._8_8_ = 0;
      auVar264._0_8_ = local_2e8;
      auVar539._8_8_ = 0;
      auVar539._0_8_ = local_2d0._8_8_;
      auVar265._8_8_ = 0;
      auVar265._0_8_ = local_2e8;
      auVar540._8_8_ = 0;
      auVar540._0_8_ = local_2c0._0_8_;
      auVar266._8_8_ = 0;
      auVar266._0_8_ = uStack_2e0;
      auVar541._8_8_ = 0;
      auVar541._0_8_ = local_2c0._0_8_ * 0x13;
      auVar267._8_8_ = 0;
      auVar267._0_8_ = uStack_2e0;
      auVar542._8_8_ = 0;
      auVar542._0_8_ = uVar569;
      auVar268._8_8_ = 0;
      auVar268._0_8_ = uStack_2e0;
      auVar543._8_8_ = 0;
      auVar543._0_8_ = uVar568;
      auVar269._8_8_ = 0;
      auVar269._0_8_ = uStack_2e0;
      auVar544._8_8_ = 0;
      auVar544._0_8_ = local_2d0._0_8_;
      auVar270._8_8_ = 0;
      auVar270._0_8_ = uStack_2e0;
      auVar545._8_8_ = 0;
      auVar545._0_8_ = local_2d0._8_8_;
      auVar271._8_8_ = 0;
      auVar271._0_8_ = local_2d8;
      auVar546._8_8_ = 0;
      auVar546._0_8_ = local_2d0._8_8_ * 0x13;
      auVar2 = auVar256 * auVar531 + auVar251 * auVar526 + auVar261 * auVar536 + auVar266 * auVar541
               + auVar271 * auVar546;
      auVar272._8_8_ = 0;
      auVar272._0_8_ = local_2d8;
      auVar547._8_8_ = 0;
      auVar547._0_8_ = local_2c0._0_8_ * 0x13;
      auVar273._8_8_ = 0;
      auVar273._0_8_ = local_2d8;
      auVar548._8_8_ = 0;
      auVar548._0_8_ = uVar569;
      auVar274._8_8_ = 0;
      auVar274._0_8_ = local_2d8;
      auVar549._8_8_ = 0;
      auVar549._0_8_ = uVar568;
      auVar275._8_8_ = 0;
      auVar275._0_8_ = local_2d8;
      auVar550._8_8_ = 0;
      auVar550._0_8_ = local_2d0._0_8_;
      auVar3 = auVar257 * auVar532 + auVar252 * auVar527 + auVar262 * auVar537 + auVar267 * auVar542
               + auVar272 * auVar547 + (auVar2 >> 0x33);
      auVar4 = auVar263 * auVar538 + auVar258 * auVar533 + auVar253 * auVar528 + auVar268 * auVar543
               + auVar273 * auVar548 + (auVar3 >> 0x33);
      auVar5 = (auVar4 >> 0x33) +
               auVar274 * auVar549 +
               auVar264 * auVar539 + auVar254 * auVar529 + auVar259 * auVar534 + auVar269 * auVar544
      ;
      uStack_218 = auVar5._0_8_;
      uVar568 = auVar5._8_8_;
      auVar559._8_8_ = uVar568 >> 0x33;
      auVar559._0_8_ = uVar568 * 0x2000 | uStack_218 >> 0x33;
      auVar559 = auVar275 * auVar550 +
                 auVar270 * auVar545 +
                 auVar265 * auVar540 + auVar260 * auVar535 + auVar255 * auVar530 + auVar559;
      uStack_210 = auVar559._0_8_;
      local_230 = (auVar559._8_8_ << 0xd | uStack_210 >> 0x33) * 0x13 +
                  (auVar2._0_8_ & 0x7ffffffffffff);
      uStack_220 = auVar4._0_8_ & 0x7ffffffffffff;
      uStack_218 = uStack_218 & 0x7ffffffffffff;
      uStack_210 = uStack_210 & 0x7ffffffffffff;
      uStack_228 = (local_230 >> 0x33) + (auVar3._0_8_ & 0x7ffffffffffff);
      local_230 = local_230 & 0x7ffffffffffff;
      Hacl_Bignum25519_fsquare((uint64_t *)local_208,&local_230);
      uVar571 = (local_208._0_8_ - local_258) + 0x3fffffffffff68;
      uVar568 = (local_208._8_8_ - uStack_250) + 0x3ffffffffffff8 + (uVar571 >> 0x33);
      local_1d0 = (local_1f8._0_8_ - local_248) + 0x3ffffffffffff8 + (uVar568 >> 0x33);
      uStack_1c8 = (local_1f8._8_8_ - uStack_240) + 0x3ffffffffffff8 + (local_1d0 >> 0x33);
      local_1d0 = local_1d0 & 0x7ffffffffffff;
      uVar569 = (uStack_1c8 >> 0x33) + ((local_1e8 + 0x3ffffffffffff8) - local_238);
      uStack_1c8 = uStack_1c8 & 0x7ffffffffffff;
      local_1c0 = uVar569 & 0x7ffffffffffff;
      uVar569 = (uVar569 >> 0x33) * 0x13 + (uVar571 & 0x7ffffffffffff);
      local_1e0 = uVar569 & 0x7ffffffffffff;
      lStack_1d8 = (uVar569 >> 0x33) + (uVar568 & 0x7ffffffffffff);
      Hacl_Bignum25519_reduce(&local_1e0);
      if ((((local_1e0 != 0) || (lStack_1d8 != 0)) || (local_1d0 != 0)) ||
         ((uStack_1c8 != 0 || (local_1c0 != 0)))) {
        uStack_2f0 = 0xd5a5fc8f189d;
        local_2f8 = 0x61b274a0ea0b0;
        uStack_2e0 = 0x78595a6804c9e;
        local_2e8 = 0x7ef5e9cbd0c60;
        local_2d8 = 0x2b8324804fc1d;
        Hacl_Bignum25519_fmul(&local_230,&local_230,&local_2f8);
      }
      Hacl_Bignum25519_reduce(&local_230);
      Hacl_Bignum25519_fsquare((uint64_t *)local_208,&local_230);
      uVar571 = (local_208._0_8_ - local_258) + 0x3fffffffffff68;
      uVar568 = (local_208._8_8_ - uStack_250) + 0x3ffffffffffff8 + (uVar571 >> 0x33);
      local_1d0 = (local_1f8._0_8_ - local_248) + 0x3ffffffffffff8 + (uVar568 >> 0x33);
      uStack_1c8 = (local_1f8._8_8_ - uStack_240) + 0x3ffffffffffff8 + (local_1d0 >> 0x33);
      local_1d0 = local_1d0 & 0x7ffffffffffff;
      uVar569 = (uStack_1c8 >> 0x33) + ((local_1e8 + 0x3ffffffffffff8) - local_238);
      uStack_1c8 = uStack_1c8 & 0x7ffffffffffff;
      local_1c0 = uVar569 & 0x7ffffffffffff;
      uVar569 = (uVar569 >> 0x33) * 0x13 + (uVar571 & 0x7ffffffffffff);
      local_1e0 = uVar569 & 0x7ffffffffffff;
      lStack_1d8 = (uVar569 >> 0x33) + (uVar568 & 0x7ffffffffffff);
      Hacl_Bignum25519_reduce(&local_1e0);
      _Var570 = false;
      _Var574 = false;
      if (((local_1e0 == 0) && (_Var574 = _Var570, lStack_1d8 == 0)) &&
         ((local_1d0 == 0 && (uStack_1c8 == 0)))) {
        _Var574 = local_1c0 == 0;
      }
      if (_Var574 != false) {
        if (((uint)local_230 & 1) != (uint)(bVar1 >> 7)) {
          local_1f8 = (undefined1  [16])0x0;
          local_208 = (undefined1  [16])0x0;
          local_1e8 = 0;
          uVar568 = (0x3ffffffffffff8 - uStack_228) + (0x3fffffffffff68 - local_230 >> 0x33);
          uStack_220 = (0x3ffffffffffff8 - uStack_220) + (uVar568 >> 0x33);
          uStack_218 = (0x3ffffffffffff8 - uStack_218) + (uStack_220 >> 0x33);
          uStack_220 = uStack_220 & 0x7ffffffffffff;
          uVar569 = (0x3ffffffffffff8 - uStack_210) + (uStack_218 >> 0x33);
          uStack_218 = uStack_218 & 0x7ffffffffffff;
          uStack_210 = uVar569 & 0x7ffffffffffff;
          uVar569 = (uVar569 >> 0x33) * 0x13 + (0x3fffffffffff68 - local_230 & 0x7ffffffffffff);
          local_230 = uVar569 & 0x7ffffffffffff;
          uStack_228 = (uVar569 >> 0x33) + (uVar568 & 0x7ffffffffffff);
          Hacl_Bignum25519_reduce(&local_230);
        }
        uStack_100 = uStack_210;
        uStack_110 = uStack_220;
        local_108 = uStack_218;
        uStack_120 = local_230;
        local_118 = uStack_228;
      }
    }
  }
  if (_Var574 != false) {
    local_150[4] = uStack_100;
    local_150[2] = uStack_110;
    local_150[3] = local_108;
    *local_150 = uStack_120;
    local_150[1] = local_118;
    local_150[5] = local_148;
    local_150[6] = uStack_140;
    local_150[7] = local_138;
    local_150[8] = uStack_130;
    local_150[9] = local_128;
    local_150[10] = 1;
    *(undefined1 (*) [16])(local_150 + 0xb) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(local_150 + 0xd) = (undefined1  [16])0x0;
    Hacl_Bignum25519_fmul(local_150 + 0xf,&uStack_120,&local_148);
  }
  return _Var574;
}

Assistant:

static bool Hacl_Impl_Ed25519_PointDecompress_point_decompress(uint64_t *out, uint8_t *s)
{
  uint64_t tmp[10U] = { 0U };
  uint64_t *y0 = tmp;
  uint64_t *x0 = tmp + (uint32_t)5U;
  uint64_t *y = tmp;
  uint64_t *x = tmp + (uint32_t)5U;
  uint8_t s31 = s[31U];
  uint64_t sign1 = (uint64_t)(s31 >> (uint32_t)7U);
  Hacl_Impl_Load51_load_51(y, s);
  bool z = Hacl_Impl_Ed25519_RecoverX_recover_x(x, y, sign1);
  bool z0 = z;
  bool res;
  if (z0 == false)
    res = false;
  else
  {
    uint64_t *outx = Hacl_Impl_Ed25519_ExtPoint_getx(out);
    uint64_t *outy = Hacl_Impl_Ed25519_ExtPoint_gety(out);
    uint64_t *outz = Hacl_Impl_Ed25519_ExtPoint_getz(out);
    uint64_t *outt = Hacl_Impl_Ed25519_ExtPoint_gett(out);
    memcpy(outx, x0, (uint32_t)5U * sizeof x0[0U]);
    memcpy(outy, y0, (uint32_t)5U * sizeof y0[0U]);
    uint64_t zero1 = (uint64_t)0U;
    uint64_t one1 = (uint64_t)1U;
    Hacl_Lib_Create64_make_h64_5(outz, one1, zero1, zero1, zero1, zero1);
    Hacl_Bignum25519_fmul(outt, x0, y0);
    res = true;
  }
  return res;
}